

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O0

void do_recite(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  OBJ_DATA *obj_00;
  CHAR_DATA *victim_00;
  int *piVar4;
  char_data *in_RDI;
  int alangbonus;
  OBJ_DATA *obj;
  OBJ_DATA *scroll;
  CHAR_DATA *victim;
  char arg2 [4608];
  char arg1 [4608];
  undefined4 in_stack_ffffffffffffdb88;
  undefined4 in_stack_ffffffffffffdb8c;
  undefined4 in_stack_ffffffffffffdb90;
  int in_stack_ffffffffffffdb94;
  undefined4 in_stack_ffffffffffffdb98;
  undefined4 in_stack_ffffffffffffdb9c;
  undefined4 in_stack_ffffffffffffdba0;
  undefined4 in_stack_ffffffffffffdba4;
  int local_2454;
  int in_stack_ffffffffffffdbb0;
  int in_stack_ffffffffffffdbb4;
  int local_243c [3];
  OBJ_DATA *local_2430;
  char in_stack_ffffffffffffdbe8;
  undefined7 in_stack_ffffffffffffdbe9;
  int in_stack_ffffffffffffdbf0;
  int in_stack_ffffffffffffdbf4;
  int in_stack_ffffffffffffdc64;
  undefined1 in_stack_ffffffffffffdc6b;
  int in_stack_ffffffffffffdc6c;
  CHAR_DATA *in_stack_ffffffffffffdc70;
  int in_stack_ffffffffffffdc8c;
  CHAR_DATA *in_stack_ffffffffffffdc90;
  char *in_stack_ffffffffffffed90;
  CHAR_DATA *in_stack_ffffffffffffed98;
  char *in_stack_ffffffffffffeda0;
  CHAR_DATA *in_stack_ffffffffffffeda8;
  
  local_243c[2] = 0;
  one_argument((char *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
               (char *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
  one_argument((char *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
               (char *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
  obj_00 = get_obj_carry(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0,
                         in_stack_ffffffffffffed98);
  if (obj_00 == (OBJ_DATA *)0x0) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffdba4,in_stack_ffffffffffffdba0),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98));
  }
  else if (obj_00->item_type == 2) {
    local_2454 = in_stack_ffffffffffffdbb0;
    if (((obj_00->pIndexData->vnum != 0x5c65) || (in_RDI->cabal == 2)) ||
       (bVar1 = is_immortal((CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88)),
       local_2454 = in_stack_ffffffffffffdbb0, bVar1)) {
      if (in_RDI->level < obj_00->level) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffdba4,in_stack_ffffffffffffdba0),
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98));
      }
      else if (in_RDI->fighting == (CHAR_DATA *)0x0) {
        local_2430 = (OBJ_DATA *)0x0;
        victim_00 = in_RDI;
        if (in_stack_ffffffffffffdbe8 != '\0') {
          victim_00 = get_char_room(in_stack_ffffffffffffed98,in_stack_ffffffffffffed90);
          local_2430 = get_obj_here((CHAR_DATA *)
                                    CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
                                    (char *)CONCAT44(in_stack_ffffffffffffdb94,
                                                     in_stack_ffffffffffffdb90));
          if ((victim_00 == (CHAR_DATA *)0x0) && (local_2430 == (OBJ_DATA *)0x0)) {
            send_to_char((char *)CONCAT44(in_stack_ffffffffffffdba4,in_stack_ffffffffffffdba0),
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98))
            ;
            return;
          }
        }
        bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
        if (!bVar1) {
          char_data::Profs(in_RDI);
          local_243c[2] =
               CProficiencies::GetProf
                         ((CProficiencies *)
                          CONCAT44(in_stack_ffffffffffffdba4,in_stack_ffffffffffffdba0),
                          (char *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98));
          if (-1 < local_243c[2]) {
            send_to_char((char *)CONCAT44(in_stack_ffffffffffffdba4,in_stack_ffffffffffffdba0),
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98))
            ;
            char_data::Profs(in_RDI);
            CProficiencies::CheckImprove
                      ((CProficiencies *)
                       CONCAT44(in_stack_ffffffffffffdba4,in_stack_ffffffffffffdba0),
                       (char *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
                       in_stack_ffffffffffffdb94);
          }
        }
        act((char *)CONCAT44(in_stack_ffffffffffffdba4,in_stack_ffffffffffffdba0),
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
            (void *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
            (void *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88),0);
        act((char *)CONCAT44(in_stack_ffffffffffffdba4,in_stack_ffffffffffffdba0),
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
            (void *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
            (void *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88),0);
        iVar2 = number_percent();
        iVar3 = get_skill(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c);
        local_243c[1] = 0;
        local_243c[0] = local_243c[2] * 3;
        piVar4 = std::max<int>(local_243c + 1,local_243c);
        if (iVar2 < (iVar3 << 2) / 5 + 0xf + *piVar4) {
          bVar1 = check_deny_magic((CHAR_DATA *)
                                   CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
          if (!bVar1) {
            in_stack_ffffffffffffdbb4 = obj_00->value[1];
            if (local_243c[2] < 0) {
              local_2454 = 0;
            }
            else {
              local_2454 = local_243c[2];
              if (3 < local_243c[2]) {
                local_2454 = 3;
              }
            }
            obj_cast_spell(in_stack_ffffffffffffdbf4,in_stack_ffffffffffffdbf0,
                           (CHAR_DATA *)
                           CONCAT71(in_stack_ffffffffffffdbe9,in_stack_ffffffffffffdbe8),victim_00,
                           obj_00);
            obj_cast_spell(in_stack_ffffffffffffdbf4,in_stack_ffffffffffffdbf0,
                           (CHAR_DATA *)
                           CONCAT71(in_stack_ffffffffffffdbe9,in_stack_ffffffffffffdbe8),victim_00,
                           obj_00);
            obj_cast_spell(in_stack_ffffffffffffdbf4,in_stack_ffffffffffffdbf0,
                           (CHAR_DATA *)
                           CONCAT71(in_stack_ffffffffffffdbe9,in_stack_ffffffffffffdbe8),victim_00,
                           obj_00);
          }
          check_improve(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc6c,
                        (bool)in_stack_ffffffffffffdc6b,in_stack_ffffffffffffdc64);
        }
        else {
          send_to_char((char *)CONCAT44(in_stack_ffffffffffffdba4,in_stack_ffffffffffffdba0),
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98));
          check_improve(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc6c,
                        (bool)in_stack_ffffffffffffdc6b,in_stack_ffffffffffffdc64);
        }
        extract_obj((OBJ_DATA *)CONCAT44(in_stack_ffffffffffffdbb4,local_2454));
      }
      else {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffdba4,in_stack_ffffffffffffdba0),
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98));
      }
    }
    else {
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffdba4,in_stack_ffffffffffffdba0),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98));
    }
  }
  else {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffdba4,in_stack_ffffffffffffdba0),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98));
  }
  return;
}

Assistant:

void do_recite(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	OBJ_DATA *scroll;
	OBJ_DATA *obj;
	int alangbonus = 0;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	scroll = get_obj_carry(ch, arg1, ch);

	if (scroll == nullptr)
	{
		send_to_char("You do not have that scroll.\n\r", ch);
		return;
	}

	if (scroll->item_type != ITEM_SCROLL)
	{
		send_to_char("You can recite only scrolls.\n\r", ch);
		return;
	}

	if (scroll->pIndexData->vnum == OBJ_VNUM_SCRIBE
		&& ch->cabal != CABAL_SCION
		&& !is_immortal(ch))
	{
		send_to_char("You fail to understand the arcane symbols.\n\r", ch);
		return;
	}

	if (ch->level < scroll->level)
	{
		send_to_char("This scroll is too complex for you to comprehend.\n\r", ch);
		return;
	}

	if (ch->fighting != nullptr)
	{
		send_to_char("You're too busy fighting to recite.\n\r", ch);
		return;
	}

	obj = nullptr;

	if (arg2[0] == '\0')
	{
		victim = ch;
	}
	else
	{
		victim = get_char_room(ch, arg2);
		obj = get_obj_here(ch, arg2);

		if (victim == nullptr && obj == nullptr)
		{
			send_to_char("You can't find it.\n\r", ch);
			return;
		}
	}

	if (!is_npc(ch))
	{
		alangbonus = ch->Profs()->GetProf("ancient languages");

		if(alangbonus > -1)
		{
			send_to_char("With your knowledge of ancient languages, you better understand the invocation of the scroll.\n\r", ch);
			ch->Profs()->CheckImprove("ancient languages", 100);
		}
	}

	act("$n recites $p.", ch, scroll, nullptr, TO_ROOM);
	act("You recite $p.", ch, scroll, nullptr, TO_CHAR);

	if (number_percent() >= 15 + get_skill(ch, gsn_scrolls) * 4 / 5 + std::max(0, alangbonus * 3))
	{
		send_to_char("You mispronounce a syllable.\n\r", ch);
		check_improve(ch, gsn_scrolls, false, 2);
	}
	else
	{
		if (!check_deny_magic(ch))
		{
			obj_cast_spell(scroll->value[1], scroll->value[0] + URANGE(0, alangbonus, 3), ch, victim, obj);
			obj_cast_spell(scroll->value[2], scroll->value[0] + URANGE(0, alangbonus, 2), ch, victim, obj);
			obj_cast_spell(scroll->value[3], scroll->value[0] + URANGE(0, alangbonus, 1), ch, victim, obj);
		}

		check_improve(ch, gsn_scrolls, true, 2);
	}

	extract_obj(scroll);
}